

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageSizeTests.cpp
# Opt level: O1

bool __thiscall
gl4cts::anon_unknown_0::NegativeCompileTime::Compile(NegativeCompileTime *this,string *source)

{
  GLuint shader;
  CallLogWrapper *this_00;
  GLint status;
  char *src;
  GLchar log [1024];
  int local_424;
  pointer local_420;
  GLchar local_418 [1024];
  
  this_00 = &(this->super_ShaderImageSizeBase).super_SubcaseBase.super_GLWrapper.
             super_CallLogWrapper;
  shader = glu::CallLogWrapper::glCreateShader(this_00,0x8b30);
  local_420 = (source->_M_dataplus)._M_p;
  glu::CallLogWrapper::glShaderSource(this_00,shader,1,&local_420,(GLint *)0x0);
  glu::CallLogWrapper::glCompileShader(this_00,shader);
  glu::CallLogWrapper::glGetShaderInfoLog(this_00,shader,0x400,(GLsizei *)0x0,local_418);
  anon_unknown_0::Output("Shader Info Log:\n%s\n",local_418);
  glu::CallLogWrapper::glGetShaderiv(this_00,shader,0x8b81,&local_424);
  glu::CallLogWrapper::glDeleteShader(this_00,shader);
  if (local_424 == 1) {
    anon_unknown_0::Output("Compilation should fail.\n");
  }
  return local_424 != 1;
}

Assistant:

bool Compile(const std::string& source)
	{
		const GLuint sh = glCreateShader(GL_FRAGMENT_SHADER);

		const char* const src = source.c_str();
		glShaderSource(sh, 1, &src, NULL);
		glCompileShader(sh);

		GLchar log[1024];
		glGetShaderInfoLog(sh, sizeof(log), NULL, log);
		Output("Shader Info Log:\n%s\n", log);

		GLint status;
		glGetShaderiv(sh, GL_COMPILE_STATUS, &status);
		glDeleteShader(sh);

		if (status == GL_TRUE)
		{
			Output("Compilation should fail.\n");
			return false;
		}
		return true;
	}